

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O3

bool google::protobuf::internal::anon_unknown_0::GetEnumValidationRange
               (EnumDescriptor *enum_type,int16_t *start,uint16_t *size)

{
  int iVar1;
  EnumValueDescriptor *pEVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  unsigned_long *__s;
  ulong uVar6;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  unsigned_long local_140 [32];
  ulong local_40;
  unsigned_long *local_38;
  
  uVar5 = enum_type->value_count_;
  uVar9 = (ulong)uVar5;
  if (uVar5 - 1 == (int)enum_type->sequential_value_limit_) {
    if ((int)uVar5 < 1) {
LAB_0028a773:
      _GLOBAL__N_1::GetEnumValidationRange();
LAB_0028a77d:
      _GLOBAL__N_1::GetEnumValidationRange();
    }
    iVar11 = enum_type->values_->number_;
    sVar3 = (short)iVar11;
    if (sVar3 == iVar11) {
      *start = sVar3;
      *size = (uint16_t)uVar5;
      return true;
    }
  }
  else {
    if ((int)uVar5 < 1) goto LAB_0028a77d;
    iVar11 = enum_type->values_->number_;
    iVar4 = iVar11;
    if (uVar5 == 1) {
      uVar9 = 1;
    }
    else {
      lVar8 = uVar9 - 1;
      piVar7 = &enum_type->values_[1].number_;
      do {
        iVar1 = *piVar7;
        if (iVar1 < iVar4) {
          iVar4 = iVar1;
        }
        if (iVar1 < iVar11) {
          iVar1 = iVar11;
        }
        iVar11 = iVar1;
        piVar7 = piVar7 + 0xc;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    lVar8 = (long)iVar11 - (long)iVar4;
    if (lVar8 < (long)uVar9) {
      if ((short)iVar4 != iVar4) {
        return false;
      }
      uVar9 = lVar8 + 1;
      if (0xffff < uVar9) {
        return false;
      }
      *start = (short)iVar4;
      *size = (uint16_t)uVar9;
      local_40 = lVar8 + 0x40U >> 6;
      if (lVar8 + 0x40U < 0x840) {
        __s = local_140;
      }
      else {
        __s = __gnu_cxx::new_allocator<unsigned_long>::allocate
                        ((new_allocator<unsigned_long> *)&local_40,local_40,(void *)0x0);
      }
      local_38 = __s;
      if (local_40 != 0) {
        memset(__s,0,local_40 << 3);
      }
      iVar11 = enum_type->value_count_;
      uVar6 = 0;
      if (0 < (long)iVar11) {
        pEVar2 = enum_type->values_;
        lVar8 = 0;
        do {
          uVar10 = (long)*(int *)((long)&pEVar2->number_ + lVar8) - (long)iVar4;
          uVar12 = uVar10 >> 6;
          if (local_40 <= uVar12) {
            _GLOBAL__N_1::GetEnumValidationRange();
            goto LAB_0028a773;
          }
          uVar5 = ((int)uVar6 + 1) - (uint)((__s[uVar12] >> (uVar10 & 0x3f) & 1) != 0);
          uVar6 = (ulong)uVar5;
          __s[uVar12] = __s[uVar12] | 1L << (uVar10 & 0x3f);
          lVar8 = lVar8 + 0x30;
        } while ((long)iVar11 * 0x30 != lVar8);
        uVar6 = (ulong)uVar5;
      }
      if (local_40 < 0x21) {
        return uVar9 == uVar6;
      }
      operator_delete(__s,local_40 << 3);
      return uVar9 == uVar6;
    }
  }
  return false;
}

Assistant:

bool GetEnumValidationRange(const EnumDescriptor* enum_type, int16_t& start,
                            uint16_t& size) {
  if (!IsEnumFullySequential(enum_type)) {
    // Maybe the labels are not sequential in declaration order, but the values
    // could still be a dense range. Try the slower approach.
    return GetEnumValidationRangeSlow(enum_type, start, size);
  }

  return SetEnumValidationRange(enum_type->value(0)->number(),
                                enum_type->value_count(), start, size);
}